

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory>
          (NLW2_NLFeeder_C_Impl *this,SuffixWriterFactory *swf)

{
  NLW2_NLFeeder_C *pNVar1;
  function<void_*(const_char_*,_int,_int)> *in_RSI;
  anon_class_24_3_766800c0 *in_RDI;
  function<void_(int,_double)> dbl_write_fn;
  function<void_(int,_int)> int_write_fn;
  SuffixDblWriter dbl_writer;
  SuffixIntWriter int_writer;
  NLW2_SuffixWriter_C sw_c;
  NLW2_SuffixWriter_C *in_stack_fffffffffffffee0;
  NLW2_SuffixWriter_C *this_00;
  SparseVectorWriter<int,_int> *__f;
  function<void_(int,_double)> *this_01;
  function<void_*(const_char_*,_int,_int)> *in_stack_ffffffffffffff00;
  function<void_(int,_double)> local_a0;
  SparseVectorWriter<int,_double> local_80 [2];
  SparseVectorWriter<int,_int> local_60;
  undefined1 local_50 [64];
  function<void_*(const_char_*,_int,_int)> *local_10;
  
  local_10 = in_RSI;
  NLW2_SuffixWriter_C::NLW2_SuffixWriter_C(in_stack_fffffffffffffee0);
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
  SparseVectorWriter<int,_int>::SparseVectorWriter(&local_60);
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
  SparseVectorWriter<int,_double>::SparseVectorWriter(local_80);
  __f = &local_60;
  this_01 = &local_a0;
  std::function<void(int,int)>::
  function<mp::NLW2_NLFeeder_C_Impl::FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory>(mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)this_01,(anon_class_8_1_0a005881 *)__f);
  std::function<void(int,double)>::
  function<mp::NLW2_NLFeeder_C_Impl::FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory>(mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory&)::_lambda(int,double)_1_,void>
            (this_01,(anon_class_8_1_125287e2 *)__f);
  std::function<void*(char_const*,int,int)>::operator=
            (in_stack_ffffffffffffff00,(anon_class_24_3_37f068e0 *)in_RDI);
  std::function<void*(char_const*,int,int)>::operator=(local_10,in_RDI);
  pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  this_00 = (NLW2_SuffixWriter_C *)pNVar1->FeedSuffixes;
  pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  (*(code *)this_00)(pNVar1->p_user_data_,local_50);
  std::function<void_(int,_double)>::~function((function<void_(int,_double)> *)0x114558);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x114565);
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
  SparseVectorWriter<int,_double>::~SparseVectorWriter(local_80);
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
  SparseVectorWriter<int,_int>::~SparseVectorWriter(&local_60);
  NLW2_SuffixWriter_C::~NLW2_SuffixWriter_C(this_00);
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedSuffixes(SuffixWriterFactory& swf) {
  NLW2_SuffixWriter_C sw_c;
  decltype( swf.StartIntSuffix(nullptr, 0, 0) ) int_writer;
  decltype( swf.StartDblSuffix(nullptr, 0, 0) ) dbl_writer;
  // These would write sparse entries
  std::function<void(int, int)> int_write_fn
      = [&int_writer](int i, int v) { int_writer.Write(i, v); };
  std::function<void(int, double)> dbl_write_fn
      = [&dbl_writer](int i, double v) { dbl_writer.Write(i, v); };
  // There would start a suffix
  sw_c.int_suf_starter_ = [&swf, &int_writer, &int_write_fn]
      (const char* suf_name, int kind, int nnz) {
    int_writer = swf.StartIntSuffix(suf_name, kind, nnz);
    return (void*)(&int_write_fn);
  };
  sw_c.dbl_suf_starter_ = [&swf, &dbl_writer, &dbl_write_fn]
      (const char* suf_name, int kind, int nnz) {
    dbl_writer = swf.StartDblSuffix(suf_name, kind, nnz);
    return (void*)(&dbl_write_fn);
  };
  assert(NLF().FeedSuffixes);
  NLF().FeedSuffixes(NLF().p_user_data_, &sw_c);
}